

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

int64_t __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::ConnectIndex
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,int elem,int connect)

{
  int iVar1;
  TPZCompElSide *this_00;
  TPZCompEl *pTVar2;
  int *piVar3;
  long *plVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  TPZCompEl *cel;
  int64_t el;
  int first;
  undefined8 local_20;
  undefined4 local_14;
  
  local_14 = 0;
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    this_00 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),local_20);
    pTVar2 = TPZCompElSide::Element(this_00);
    if (pTVar2 != (TPZCompEl *)0x0) {
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x40),local_20);
      if (*piVar3 != 0) {
        iVar1 = (**(code **)(*(long *)pTVar2 + 0x90))();
        local_14 = iVar1 + local_14;
      }
    }
  }
  plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xe8),(long)(local_14 + in_EDX));
  return *plVar4;
}

Assistant:

int64_t TPZMultiphysicsCompEl<TGeometry>::ConnectIndex(int elem, int connect) const {
    
    int first = 0;
    for(int64_t el=0; el<elem; el++){
        TPZCompEl *cel = fElementVec[el].Element();
        if (cel && fActiveApproxSpace[el]) {
            first+=cel->NConnects();
        }
    }
    return fConnectIndexes[first+connect];
}